

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O2

void __thiscall Assimp::MDLImporter::SetupProperties(MDLImporter *this,Importer *pImp)

{
  uint uVar1;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  uVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_MDL_KEYFRAME",-1);
  this->configFrameID = uVar1;
  if (uVar1 == 0xffffffff) {
    uVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_GLOBAL_KEYFRAME",0);
    this->configFrameID = uVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"colormap.lmp",&local_59);
  Importer::GetPropertyString(&local_58,pImp,"IMPORT_MDL_COLORMAP",&local_38);
  std::__cxx11::string::_M_assign((string *)&this->configPalette);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void MDLImporter::SetupProperties(const Importer* pImp)
{
    configFrameID = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_MDL_KEYFRAME,-1);

    // The
    // AI_CONFIG_IMPORT_MDL_KEYFRAME option overrides the
    // AI_CONFIG_IMPORT_GLOBAL_KEYFRAME option.
    if(static_cast<unsigned int>(-1) == configFrameID)  {
        configFrameID =  pImp->GetPropertyInteger(AI_CONFIG_IMPORT_GLOBAL_KEYFRAME,0);
    }

    // AI_CONFIG_IMPORT_MDL_COLORMAP - palette file
    configPalette =  pImp->GetPropertyString(AI_CONFIG_IMPORT_MDL_COLORMAP,"colormap.lmp");
}